

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

BOOL CreateDirectoryW(LPCWSTR lpPathName,LPSECURITY_ATTRIBUTES lpSecurityAttributes)

{
  bool bVar1;
  FILE *pFVar2;
  int cbMultiByte;
  int iVar3;
  BOOL BVar4;
  DWORD DVar5;
  LPCSTR lpMultiByteStr;
  uint *puVar6;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00328f8e;
  if (lpSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    BVar4 = 0;
    cbMultiByte = WideCharToMultiByte(0,0,lpPathName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (cbMultiByte == 0) {
      fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
              ,0x4d);
      pFVar2 = _stderr;
      DVar5 = GetLastError();
      fprintf(pFVar2,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar5);
      DVar5 = 0x54f;
      bVar1 = false;
      lpMultiByteStr = (LPCSTR)0x0;
    }
    else {
      lpMultiByteStr = (LPCSTR)PAL_malloc((long)cbMultiByte);
      if (lpMultiByteStr != (LPCSTR)0x0) {
        DVar5 = 0;
        iVar3 = WideCharToMultiByte(0,0,lpPathName,-1,lpMultiByteStr,cbMultiByte,(LPCSTR)0x0,
                                    (LPBOOL)0x0);
        if (iVar3 == cbMultiByte) {
          BVar4 = CreateDirectoryA(lpMultiByteStr,(LPSECURITY_ATTRIBUTES)0x0);
          bVar1 = true;
          goto LAB_00328f5b;
        }
      }
      bVar1 = false;
      fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
              ,0x57);
      pFVar2 = _stderr;
      DVar5 = GetLastError();
      puVar6 = (uint *)__errno_location();
      fprintf(pFVar2,"WideCharToMultiByte or PAL_malloc failure! LastError:%d errno:%d\n",
              (ulong)DVar5,(ulong)*puVar6);
      DVar5 = 0x54f;
      BVar4 = 0;
    }
  }
  else {
    bVar1 = false;
    fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
            ,0x44);
    fprintf(_stderr,"lpSecurityAttributes is not NULL as it should be\n");
    DVar5 = 0x57;
    BVar4 = 0;
    lpMultiByteStr = (LPCSTR)0x0;
  }
LAB_00328f5b:
  if (!bVar1) {
    SetLastError(DVar5);
  }
  if (lpMultiByteStr != (LPCSTR)0x0) {
    PAL_free(lpMultiByteStr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar4;
  }
LAB_00328f8e:
  abort();
}

Assistant:

BOOL
PALAPI
CreateDirectoryW(
         IN LPCWSTR lpPathName,
         IN LPSECURITY_ATTRIBUTES lpSecurityAttributes)
{
    BOOL  bRet = FALSE;
    DWORD dwLastError = 0;
    int   mb_size;
    char  *mb_dir = NULL;

    PERF_ENTRY(CreateDirectoryW);
    ENTRY("CreateDirectoryW(lpPathName=%p (%S), lpSecurityAttr=%p)\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING, lpSecurityAttributes);

    if ( lpSecurityAttributes )
    {
        ASSERT("lpSecurityAttributes is not NULL as it should be\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    /* translate the wide char lpPathName string to multibyte string */
    if(0 == (mb_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, NULL, 0,
                                            NULL, NULL )))
    {
        ASSERT("WideCharToMultiByte failure! error is %d\n", GetLastError());
        dwLastError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    if (((mb_dir = (char *)PAL_malloc(mb_size)) == NULL) ||
        (WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, mb_dir, mb_size, NULL,
                              NULL) != mb_size))
    {
        ASSERT("WideCharToMultiByte or PAL_malloc failure! LastError:%d errno:%d\n",
              GetLastError(), errno);
        dwLastError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    bRet = CreateDirectoryA(mb_dir,NULL);
done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }
    if (mb_dir != NULL)
    {
        PAL_free(mb_dir);
    }
    LOGEXIT("CreateDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(CreateDirectoryW);
    return bRet;
}